

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceSyncDecoderTest::PriceSyncDecoderTest
          (PriceSyncDecoderTest *this)

{
  allocator<char> local_179;
  string local_178 [32];
  FieldDef local_158 [55];
  allocator<char> local_121;
  string local_120 [32];
  FieldDef local_100 [55];
  allocator<char> local_c9;
  string local_c8 [32];
  FieldDef local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  FieldDef local_50 [64];
  PriceSyncDecoderTest *local_10;
  PriceSyncDecoderTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PriceSyncDecoderTest_003d8318;
  bidfx_public_api::price::pixie::PriceSyncDecoder::PriceSyncDecoder(&this->decoder);
  ExtendableDataDictionary::ExtendableDataDictionary(&this->data_dictionary);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"Bid",&local_71);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_50,0,0x44,local_70);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
            (&this->data_dictionary,local_50);
  FieldDef::~FieldDef(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"BidSize",&local_c9);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_a8,1,0x4c,local_c8);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
            (&this->data_dictionary,local_a8);
  FieldDef::~FieldDef(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"Ask",&local_121);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_100,2,0x44,local_120);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
            (&this->data_dictionary,local_100);
  FieldDef::~FieldDef(local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"AskSize",&local_179);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_158,3,0x4c,local_178);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
            (&this->data_dictionary,local_158);
  FieldDef::~FieldDef(local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  return;
}

Assistant:

PriceSyncDecoderTest()
    {
        data_dictionary.AddFieldDef(FieldDef(0, FieldTypeEnum::DOUBLE, "Bid"));
        data_dictionary.AddFieldDef(FieldDef(1, FieldTypeEnum::LONG, "BidSize"));
        data_dictionary.AddFieldDef(FieldDef(2, FieldTypeEnum::DOUBLE, "Ask"));
        data_dictionary.AddFieldDef(FieldDef(3, FieldTypeEnum::LONG, "AskSize"));
    }